

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.cc
# Opt level: O1

void __thiscall Graph::update_edge(Graph *this,string *begin,string *end,double weight)

{
  pointer pGVar1;
  size_t sVar2;
  size_t __n;
  bool bVar3;
  int iVar4;
  GNode *pGVar5;
  GNode *pGVar6;
  ostream *poVar7;
  GEdge *edge;
  pointer pGVar8;
  
  bVar3 = search(this,begin);
  if (bVar3) {
    pGVar5 = get_node(this,begin);
    bVar3 = search(this,end);
    begin = end;
    if (bVar3) {
      pGVar6 = get_node(this,end);
      pGVar8 = (pGVar5->edges).super__Vector_base<Graph::GEdge,_std::allocator<Graph::GEdge>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pGVar1 = (pGVar5->edges).super__Vector_base<Graph::GEdge,_std::allocator<Graph::GEdge>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pGVar8 != pGVar1) {
        sVar2 = (pGVar6->name)._M_string_length;
        do {
          __n = (pGVar8->node->name)._M_string_length;
          if ((__n == sVar2) &&
             ((__n == 0 ||
              (iVar4 = bcmp((pGVar8->node->name)._M_dataplus._M_p,(pGVar6->name)._M_dataplus._M_p,
                            __n), iVar4 == 0)))) {
            pGVar8->weight = weight;
          }
          pGVar8 = pGVar8 + 1;
        } while (pGVar8 != pGVar1);
      }
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error: no node \"",0x10)
  ;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(begin->_M_dataplus)._M_p,begin->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" exists \n",10);
  return;
}

Assistant:

void Graph::update_edge(const std::string &begin, const std::string &end, double weight) {
    if (search(begin)) {
        GNode *origin = get_node(begin);
        GNode *dest;

        if (search(end)) {
            dest = get_node(end);
            for (auto & edge : origin->edges) {
                if (edge.node->name == dest->name) {
                    edge.weight = weight;
                }
            }
        } else {
            cout << "Error: no node \"" << end << "\" exists \n";
        }
    } else {
        cout << "Error: no node \"" << begin << "\" exists \n";
    }
}